

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedPatternSyntax *pPVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::PatternSyntax_*>::operator*
            ((not_null<slang::syntax::PatternSyntax_*> *)0x94c4e3);
  deepClone<slang::syntax::PatternSyntax>((PatternSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParenthesizedPatternSyntax,slang::parsing::Token,slang::syntax::PatternSyntax&,slang::parsing::Token>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParenthesizedPatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParenthesizedPatternSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<PatternSyntax>(*node.pattern, alloc),
        node.closeParen.deepClone(alloc)
    );
}